

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

HRESULT __thiscall
Js::ScriptContext::OnDebuggerAttachedDetached
          (ScriptContext *this,bool attach,NativeCodeGenerator **previousCodeGenHolder)

{
  ThreadContext *threadContext;
  DebugContext *pDVar1;
  ProbeContainer *this_00;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *this_01;
  Cache *pCVar2;
  SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> **ppSVar3;
  SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *this_02;
  AutoNestedHandledExceptionType local_48;
  OutOfMemoryException anon_var_0;
  undefined4 uStack_44;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  HRESULT hr;
  AutoRestore local_30;
  AutoRestore autoRestore;
  NativeCodeGenerator **previousCodeGenHolder_local;
  bool attach_local;
  ScriptContext *this_local;
  
  autoRestore.threadContext = (ThreadContext *)previousCodeGenHolder;
  threadContext = GetThreadContext(this);
  OnDebuggerAttachedDetached::AutoRestore::AutoRestore(&local_30,threadContext);
  ThreadContext::InvalidateAllProtoInlineCaches(this->threadContext);
  ThreadContext::InvalidateAllStoreFieldInlineCaches(this->threadContext);
  ThreadContext::InvalidateAllIsInstInlineCaches(this->threadContext);
  if (!attach) {
    UnRegisterDebugThunk(this);
    pDVar1 = GetDebugContext(this);
    this_00 = DebugContext::GetProbeContainer(pDVar1);
    Js::ProbeContainer::RemoveAllProbes(this_00);
  }
  __autoNestedHandledExceptionType.savedData.handledExceptionType = (Data)ExceptionType_None;
  if ((DAT_01ea9ee7 & 1) == 0) {
    __autoNestedHandledExceptionType.savedData.handledExceptionType =
         (Data)RecreateNativeCodeGenerator(this,(NativeCodeGenerator **)autoRestore.threadContext);
    this_local._4_4_ =
         (ExceptionType)__autoNestedHandledExceptionType.savedData.handledExceptionType;
    if ((int)__autoNestedHandledExceptionType.savedData.handledExceptionType < 0) goto LAB_00a624ec;
    if (attach) {
      pDVar1 = GetDebugContext(this);
      DebugContext::SetDebuggerMode(pDVar1,Debugging);
      UpdateNativeCodeGeneratorForDebugMode(this->nativeCodeGen);
    }
  }
  else if (attach) {
    pDVar1 = GetDebugContext(this);
    DebugContext::SetDebuggerMode(pDVar1,Debugging);
  }
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_48,ExceptionType_OutOfMemory);
  this_01 = Memory::
            RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
            ::operator->(&this->sourceList);
  JsUtil::
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>*,Memory::Recycler,false,Js::FreeListedRemovePolicy,DefaultComparer>
  ::Map<Js::ScriptContext::OnDebuggerAttachedDetached(bool,NativeCodeGenerator**)::__0>
            ((List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>*,Memory::Recycler,false,Js::FreeListedRemovePolicy,DefaultComparer>
              *)this_01,(anon_class_1_1_4d42df83)attach);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_48);
  if ((int)__autoNestedHandledExceptionType.savedData.handledExceptionType < 0) {
    this_local._4_4_ = __autoNestedHandledExceptionType.savedData.handledExceptionType;
  }
  else {
    if (attach) {
      RegisterDebugThunk(this,true);
    }
    pCVar2 = Cache(this);
    ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_SListBase__
                        ((WriteBarrierPtr *)&pCVar2->profileInfoList);
    if (*ppSVar3 != (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
      pCVar2 = Cache(this);
      this_02 = Memory::
                WriteBarrierPtr<SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>_>::
                operator->(&pCVar2->profileInfoList);
      SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::Reset(this_02);
    }
    this_local._4_4_ = __autoNestedHandledExceptionType.savedData.handledExceptionType;
  }
LAB_00a624ec:
  uStack_44 = 1;
  OnDebuggerAttachedDetached::AutoRestore::~AutoRestore(&local_30);
  return this_local._4_4_;
}

Assistant:

HRESULT ScriptContext::OnDebuggerAttachedDetached(bool attach)
#endif
    {

        // notify threadContext that debugger is attaching so do not do expire
        struct AutoRestore
        {
            AutoRestore(ThreadContext* threadContext)
                :threadContext(threadContext)
            {
                this->threadContext->GetDebugManager()->SetDebuggerAttaching(true);
            }
            ~AutoRestore()
            {
                this->threadContext->GetDebugManager()->SetDebuggerAttaching(false);
            }

        private:
            ThreadContext* threadContext;

        } autoRestore(this->GetThreadContext());

        // Invalidate all the caches.
        this->threadContext->InvalidateAllProtoInlineCaches();
        this->threadContext->InvalidateAllStoreFieldInlineCaches();
        this->threadContext->InvalidateAllIsInstInlineCaches();

        if (!attach)
        {
            this->UnRegisterDebugThunk();

            // Remove all breakpoint probes
            this->GetDebugContext()->GetProbeContainer()->RemoveAllProbes();
        }

        HRESULT hr = S_OK;

        if (!CONFIG_FLAG(ForceDiagnosticsMode))
        {
#if ENABLE_NATIVE_CODEGEN
            // Recreate the native code generator so that all pending
            // JIT work items will be cleared.
            hr = RecreateNativeCodeGenerator(previousCodeGenHolder);
            if (FAILED(hr))
            {
                return hr;
            }
#endif
            if (attach)
            {
                // We need to transition to debug mode after the NativeCodeGenerator is cleared/closed. Since the NativeCodeGenerator will be working on a different thread - it may
                // be checking on the DebuggerState (from ScriptContext) while emitting code.
                this->GetDebugContext()->SetDebuggerMode(Js::DebuggerMode::Debugging);
#if ENABLE_NATIVE_CODEGEN
                UpdateNativeCodeGeneratorForDebugMode(this->nativeCodeGen);
#endif
            }
        }
        else if (attach)
        {
            this->GetDebugContext()->SetDebuggerMode(Js::DebuggerMode::Debugging);
        }

        BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
        {
            // Remap all the function entry point thunks.
            this->sourceList->Map([=](uint i, RecyclerWeakReference<Js::Utf8SourceInfo>* sourceInfoWeakRef) {
                Js::Utf8SourceInfo* sourceInfo = sourceInfoWeakRef->Get();

                if (sourceInfo != nullptr)
                {
                    if (!sourceInfo->GetIsLibraryCode())
                    {
                        sourceInfo->SetInDebugMode(attach);

                        sourceInfo->MapFunction([](Js::FunctionBody* functionBody) {
                            functionBody->SetEntryToDeferParseForDebugger();
                        });
                    }
                    else
                    {
                        sourceInfo->MapFunction([](Js::FunctionBody* functionBody) {
                            functionBody->ResetEntryPoint();
                        });
                    }
                }
            });
        }